

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ManAppendCo(Gia_Man_t *p,int iLit0)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  if (-1 < iLit0) {
    iVar1 = Abc_Lit2Var(iLit0);
    iVar2 = Gia_ManObjNum(p);
    if (iVar1 < iVar2) {
      iVar1 = Abc_Lit2Var(iLit0);
      pGVar4 = Gia_ManObj(p,iVar1);
      iVar1 = Gia_ObjIsCo(pGVar4);
      if (iVar1 == 0) {
        pGVar4 = Gia_ManAppendObj(p);
        *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xffffffff7fffffff | 0x80000000;
        iVar1 = Gia_ObjId(p,pGVar4);
        iVar2 = Abc_Lit2Var(iLit0);
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xffffffffe0000000 | (ulong)(uint)(iVar1 - iVar2) & 0x1fffffff;
        uVar3 = Abc_LitIsCompl(iLit0);
        *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xffffffffdfffffff | ((ulong)uVar3 & 1) << 0x1d;
        uVar3 = Vec_IntSize(p->vCos);
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xe0000000ffffffff | ((ulong)uVar3 & 0x1fffffff) << 0x20;
        p_00 = p->vCos;
        iVar1 = Gia_ObjId(p,pGVar4);
        Vec_IntPush(p_00,iVar1);
        if (p->pFanData != (int *)0x0) {
          pObj_00 = Gia_ObjFanin0(pGVar4);
          Gia_ObjAddFanout(p,pObj_00,pGVar4);
        }
        iVar1 = Gia_ObjId(p,pGVar4);
        return iVar1 << 1;
      }
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

static inline int Gia_ManAppendCo( Gia_Man_t * p, int iLit0 )  
{ 
    Gia_Obj_t * pObj;
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( !Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0))) );
    pObj = Gia_ManAppendObj( p );    
    pObj->fTerm = 1;
    pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
    pObj->fCompl0 = Abc_LitIsCompl(iLit0);
    pObj->iDiff1  = Vec_IntSize( p->vCos );
    Vec_IntPush( p->vCos, Gia_ObjId(p, pObj) );
    if ( p->pFanData )
        Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
    return Gia_ObjId( p, pObj ) << 1;
}